

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

wsum_t * __thiscall Clasp::UncoreMinimize::computeSum(UncoreMinimize *this,Solver *s)

{
  bool bVar1;
  SharedMinimizeData *this_00;
  long *in_RSI;
  WeightLiteral *in_RDI;
  WeightLiteral *it;
  size_type sVar2;
  size_type sVar3;
  long *in_stack_ffffffffffffffe0;
  
  SharedMinimizeData::numRules((SharedMinimizeData *)0x1b3eb9);
  std::fill_n<long*,unsigned_int,long>(in_RSI,0,in_stack_ffffffffffffffe0);
  this_00 = (SharedMinimizeData *)((long)in_RDI[1] + 0x68);
  while( true ) {
    sVar3 = *(size_type *)&(this_00->adjust_).ebo_.buf;
    bVar1 = isSentinel((Literal)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    sVar2 = *(size_type *)&(this_00->adjust_).ebo_.buf;
    bVar1 = Solver::isTrue((Solver *)CONCAT44(sVar3,sVar2),(Literal)(uint32)((ulong)this_00 >> 0x20)
                          );
    if (bVar1) {
      SharedMinimizeData::add(this_00,(wsum_t *)CONCAT44(sVar3,sVar2),in_RDI);
    }
    this_00 = (SharedMinimizeData *)&(this_00->adjust_).ebo_.size;
  }
  return (wsum_t *)in_RDI[4];
}

Assistant:

wsum_t* UncoreMinimize::computeSum(const Solver& s) const {
	std::fill_n(sum_, shared_->numRules(), wsum_t(0));
	for (const WeightLiteral* it = shared_->lits; !isSentinel(it->first); ++it) {
		if (s.isTrue(it->first)) { shared_->add(sum_, *it); }
	}
	return sum_;
}